

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkPointeeTypeAsFullUsed
          (EliminateDeadMembersPass *this,uint32_t ptr_type_id)

{
  IRContext *this_00;
  uint32_t type_id;
  Instruction *this_01;
  uint uVar1;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = analysis::DefUseManager::GetDef
                      ((this_00->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,ptr_type_id);
  if (this_01->opcode_ == OpTypePointer) {
    uVar1 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar1 = (uint)this_01->has_result_id_;
    }
    type_id = Instruction::GetSingleWordOperand(this_01,uVar1 + 1);
    MarkTypeAsFullyUsed(this,type_id);
    return;
  }
  __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0xa9,
                "void spvtools::opt::EliminateDeadMembersPass::MarkPointeeTypeAsFullUsed(uint32_t)")
  ;
}

Assistant:

void EliminateDeadMembersPass::MarkPointeeTypeAsFullUsed(uint32_t ptr_type_id) {
  Instruction* ptr_type_inst = get_def_use_mgr()->GetDef(ptr_type_id);
  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer);
  MarkTypeAsFullyUsed(ptr_type_inst->GetSingleWordInOperand(1));
}